

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O2

vector<bool,_std::allocator<bool>_> * __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
::get_content(vector<bool,_std::allocator<bool>_> *__return_storage_ptr__,
             Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>,_std::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>_>
             *this,int columnLength)

{
  ulong in_RAX;
  pointer ppEVar1;
  reference rVar2;
  undefined8 uStack_28;
  
  if (columnLength < 0) {
    ppEVar1 = (this->column_).
              super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppEVar1 ==
        (this->column_).
        super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
      *(undefined8 *)
       &(__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_offset = 0;
      (__return_storage_ptr__->super__Bvector_base<std::allocator<bool>_>)._M_impl.
      super__Bvector_impl_data._M_end_of_storage = (_Bit_pointer)0x0;
      return __return_storage_ptr__;
    }
    columnLength = ppEVar1[-1]->rowIndex_ + 1;
  }
  uStack_28 = in_RAX & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (__return_storage_ptr__,(long)columnLength,(bool *)((long)&uStack_28 + 7),
             (allocator_type *)((long)&uStack_28 + 6));
  for (ppEVar1 = (this->column_).
                 super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      (ppEVar1 !=
       (this->column_).
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)4,_true,_true,_true>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish && ((*ppEVar1)->rowIndex_ < (uint)columnLength));
      ppEVar1 = ppEVar1 + 1) {
    rVar2 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (__return_storage_ptr__,(ulong)(*ppEVar1)->rowIndex_);
    *rVar2._M_p = *rVar2._M_p | rVar2._M_mask;
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<typename Naive_vector_column<Master_matrix,Support>::Field_element>
Naive_vector_column<Master_matrix,Support>::get_content(int columnLength) const
{
  if (columnLength < 0 && column_.size() > 0)
    columnLength = column_.back()->get_row_index() + 1;
  else if (columnLength < 0)
    return std::vector<Field_element>();

  std::vector<Field_element> container(columnLength, 0);
  for (auto it = column_.begin(); it != column_.end() && (*it)->get_row_index() < static_cast<ID_index>(columnLength);
       ++it) {
    if constexpr (Master_matrix::Option_list::is_z2) {
      container[(*it)->get_row_index()] = 1;
    } else {
      container[(*it)->get_row_index()] = (*it)->get_element();
    }
  }
  return container;
}